

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedPaths(CrateReader *this,uint64_t maxNumPaths)

{
  StreamReader *pSVar1;
  void *pvVar2;
  bool bVar3;
  ostream *poVar4;
  void *pvVar5;
  size_t __n;
  char *pcVar6;
  void *pvVar7;
  uint *ints;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  size_type sVar11;
  string *err_00;
  vector<bool,_std::allocator<bool>_> *visit_table_00;
  string local_1f68;
  allocator local_1f41;
  string local_1f40 [32];
  string local_1f20;
  ostringstream local_1f00 [8];
  ostringstream ss_e_16;
  reference local_1d88;
  ulong local_1d78;
  size_t i_3;
  ulong local_1d60;
  size_t i_2;
  allocator local_1d31;
  string local_1d30 [32];
  string local_1d10;
  ostringstream local_1cf0 [8];
  ostringstream ss_e_15;
  reference local_1b78;
  ulong local_1b68;
  size_t i_1;
  size_t sumDecodedPaths;
  undefined1 local_1a88 [8];
  BuildDecompressedPathsArg arg;
  ulong local_1978;
  size_t i;
  ostringstream local_1950 [8];
  ostringstream ss_e_14;
  undefined1 local_17d8 [8];
  vector<bool,_std::allocator<bool>_> visit_table;
  ostringstream local_1790 [8];
  ostringstream ss_e_13;
  undefined1 local_1618 [8];
  string err_2;
  ostringstream local_15d8 [8];
  ostringstream ss_e_12;
  string local_1460;
  ostringstream local_1440 [8];
  ostringstream ss_e_11;
  string local_12c8;
  ostringstream local_12a8 [8];
  ostringstream ss_e_10;
  string local_1130;
  ostringstream local_1110 [8];
  ostringstream ss_e_9;
  void *local_f98;
  uint64_t compJumpsSize;
  ostringstream local_f70 [8];
  ostringstream ss_e_8;
  undefined1 local_df8 [8];
  string err_1;
  ostringstream local_db8 [8];
  ostringstream ss_e_7;
  string local_c40;
  ostringstream local_c20 [8];
  ostringstream ss_e_6;
  string local_aa8;
  ostringstream local_a88 [8];
  ostringstream ss_e_5;
  void *local_910;
  uint64_t compElementTokenIndexesSize;
  undefined1 local_8e8 [8];
  string err;
  ostringstream local_8a8 [8];
  ostringstream ss_e_4;
  string local_730;
  ostringstream local_710 [8];
  ostringstream ss_e_3;
  void *local_598;
  uint64_t compPathIndexesSize;
  undefined1 local_588 [8];
  vector<char,_std::allocator<char>_> workingSpace;
  undefined1 local_568 [8];
  vector<char,_std::allocator<char>_> compBuffer;
  ostringstream local_530 [8];
  ostringstream ss_e_2;
  string local_3b8;
  ostringstream local_398 [8];
  ostringstream ss_e_1;
  size_t workspaceBufferSize;
  size_t compBufferSize;
  ostringstream local_1f0 [8];
  ostringstream ss_e;
  ulong local_70;
  uint64_t numEncodedPaths;
  vector<int,_std::allocator<int>_> jumps;
  vector<int,_std::allocator<int>_> elementTokenIndexes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pathIndexes;
  uint64_t maxNumPaths_local;
  CrateReader *this_local;
  
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &elementTokenIndexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &jumps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&numEncodedPaths);
  bVar3 = StreamReader::read8(this->_sr,&local_70);
  if (bVar3) {
    if (maxNumPaths < local_70) {
      ::std::__cxx11::string::operator+=
                ((string *)&this->_err,"Size mismatch of numEncodedPaths at `PATHS` section.\n");
      this_local._7_1_ = 0;
    }
    else {
      this->_memoryUsage = local_70 * 0xc + this->_memoryUsage;
      if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
        ::std::__cxx11::ostringstream::ostringstream(local_1f0);
        poVar4 = ::std::operator<<((ostream *)local_1f0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[Crate]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1455);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)local_1f0,"Reached to max memory budget.");
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&compBufferSize);
        ::std::__cxx11::string::~string((string *)&compBufferSize);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_1f0);
      }
      else {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &elementTokenIndexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_70);
        ::std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   &jumps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_70);
        ::std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)&numEncodedPaths,local_70);
        pvVar5 = (void *)Usd_IntegerCompression::GetCompressedBufferSize(local_70);
        __n = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(local_70);
        this->_memoryUsage = (long)pvVar5 + this->_memoryUsage;
        if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
          ::std::__cxx11::ostringstream::ostringstream(local_398);
          poVar4 = ::std::operator<<((ostream *)local_398,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,"[Crate]");
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x145d);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)local_398,"Reached to max memory budget.");
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_3b8);
          ::std::__cxx11::string::~string((string *)&local_3b8);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_398);
        }
        else {
          this->_memoryUsage = __n + this->_memoryUsage;
          if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
            ::std::__cxx11::ostringstream::ostringstream(local_530);
            poVar4 = ::std::operator<<((ostream *)local_530,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,"[Crate]");
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x145e);
            ::std::operator<<(poVar4," ");
            poVar4 = ::std::operator<<((ostream *)local_530,"Reached to max memory budget.");
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)
                           &compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
            ::std::__cxx11::string::~string
                      ((string *)
                       &compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_530);
          }
          else {
            ::std::allocator<char>::allocator();
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)local_568,(size_type)pvVar5,
                       (allocator_type *)
                       &workingSpace.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x17);
            ::std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &workingSpace.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x17);
            ::std::allocator<char>::allocator();
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)local_588,__n,
                       (allocator_type *)((long)&compPathIndexesSize + 7));
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&compPathIndexesSize + 7));
            bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_598);
            pvVar2 = local_598;
            if (bVar3) {
              if (pvVar5 < local_598) {
                ::std::__cxx11::ostringstream::ostringstream(local_710);
                poVar4 = ::std::operator<<((ostream *)local_710,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,"[Crate]");
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x146d);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)local_710,
                                           "Invalid Compressed PathIndexes size.");
                ::std::operator<<(poVar4,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_730);
                ::std::__cxx11::string::~string((string *)&local_730);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_710);
              }
              else {
                this->_memoryUsage = (long)local_598 + this->_memoryUsage;
                if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                  ::std::__cxx11::ostringstream::ostringstream(local_8a8);
                  poVar4 = ::std::operator<<((ostream *)local_8a8,"[error]");
                  poVar4 = ::std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar4 = ::std::operator<<(poVar4,"[Crate]");
                  poVar4 = ::std::operator<<(poVar4,":");
                  poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                  poVar4 = ::std::operator<<(poVar4,"():");
                  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1470);
                  ::std::operator<<(poVar4," ");
                  poVar4 = ::std::operator<<((ostream *)local_8a8,"Reached to max memory budget.");
                  ::std::operator<<(poVar4,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)((long)&err.field_2 + 8));
                  ::std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_8a8);
                }
                else {
                  pSVar1 = this->_sr;
                  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                     ((vector<char,_std::allocator<char>_> *)local_568);
                  pvVar7 = (void *)StreamReader::read(pSVar1,(int)pvVar2,pvVar2,(size_t)pcVar6);
                  if (pvVar2 == pvVar7) {
                    ::std::__cxx11::string::string((string *)local_8e8);
                    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                       ((vector<char,_std::allocator<char>_> *)local_568);
                    ints = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      &elementTokenIndexes.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
                    uVar9 = local_70;
                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                       ((vector<char,_std::allocator<char>_> *)local_588);
                    Usd_IntegerCompression::DecompressFromBuffer
                              (pcVar6,(size_t)local_598,ints,uVar9,(string *)local_8e8,pcVar8);
                    uVar9 = ::std::__cxx11::string::empty();
                    bVar3 = (uVar9 & 1) != 0;
                    if (!bVar3) {
                      ::std::operator+((char *)&compElementTokenIndexesSize,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"Failed to decode pathIndexes\n");
                      ::std::__cxx11::string::operator+=
                                ((string *)&this->_err,(string *)&compElementTokenIndexesSize);
                      ::std::__cxx11::string::~string((string *)&compElementTokenIndexesSize);
                      this_local._7_1_ = 0;
                    }
                    ::std::__cxx11::string::~string((string *)local_8e8);
                    if (bVar3) {
                      bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_910);
                      pvVar2 = local_910;
                      if (bVar3) {
                        if (pvVar5 < local_910) {
                          ::std::__cxx11::ostringstream::ostringstream(local_a88);
                          poVar4 = ::std::operator<<((ostream *)local_a88,"[error]");
                          poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar4 = ::std::operator<<(poVar4,"[Crate]");
                          poVar4 = ::std::operator<<(poVar4,":");
                          poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                          poVar4 = ::std::operator<<(poVar4,"():");
                          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x148f);
                          ::std::operator<<(poVar4," ");
                          poVar4 = ::std::operator<<((ostream *)local_a88,
                                                     "Invalid Compressed elementTokenIndexes size.")
                          ;
                          ::std::operator<<(poVar4,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,&local_aa8);
                          ::std::__cxx11::string::~string((string *)&local_aa8);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_a88);
                        }
                        else {
                          this->_memoryUsage = (long)local_910 + this->_memoryUsage;
                          if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                            ::std::__cxx11::ostringstream::ostringstream(local_c20);
                            poVar4 = ::std::operator<<((ostream *)local_c20,"[error]");
                            poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                            poVar4 = ::std::operator<<(poVar4,"[Crate]");
                            poVar4 = ::std::operator<<(poVar4,":");
                            poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                            poVar4 = ::std::operator<<(poVar4,"():");
                            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1492);
                            ::std::operator<<(poVar4," ");
                            poVar4 = ::std::operator<<((ostream *)local_c20,
                                                       "Reached to max memory budget.");
                            ::std::operator<<(poVar4,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,&local_c40);
                            ::std::__cxx11::string::~string((string *)&local_c40);
                            this_local._7_1_ = 0;
                            ::std::__cxx11::ostringstream::~ostringstream(local_c20);
                          }
                          else {
                            pSVar1 = this->_sr;
                            pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                               ((vector<char,_std::allocator<char>_> *)local_568);
                            pvVar7 = (void *)StreamReader::read(pSVar1,(int)pvVar2,pvVar2,
                                                                (size_t)pcVar6);
                            if (pvVar2 == pvVar7) {
                              ::std::__cxx11::string::string((string *)local_df8);
                              pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                                 ((vector<char,_std::allocator<char>_> *)local_568);
                              piVar10 = ::std::vector<int,_std::allocator<int>_>::data
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   &jumps.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              ;
                              uVar9 = local_70;
                              pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                 ((vector<char,_std::allocator<char>_> *)local_588);
                              Usd_IntegerCompression::DecompressFromBuffer
                                        (pcVar6,(size_t)local_910,piVar10,uVar9,(string *)local_df8,
                                         pcVar8);
                              uVar9 = ::std::__cxx11::string::empty();
                              bVar3 = (uVar9 & 1) != 0;
                              if (!bVar3) {
                                ::std::__cxx11::ostringstream::ostringstream(local_f70);
                                poVar4 = ::std::operator<<((ostream *)local_f70,"[error]");
                                poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                poVar4 = ::std::operator<<(poVar4,":");
                                poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                                poVar4 = ::std::operator<<(poVar4,"():");
                                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x14a3);
                                ::std::operator<<(poVar4," ");
                                poVar4 = ::std::operator<<((ostream *)local_f70,
                                                           "Failed to decode elementTokenIndexes.");
                                ::std::operator<<(poVar4,"\n");
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,(string *)&compJumpsSize);
                                ::std::__cxx11::string::~string((string *)&compJumpsSize);
                                ::std::__cxx11::ostringstream::~ostringstream(local_f70);
                                this_local._7_1_ = 0;
                              }
                              ::std::__cxx11::string::~string((string *)local_df8);
                              if (bVar3) {
                                bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_f98);
                                pvVar2 = local_f98;
                                if (bVar3) {
                                  if (pvVar5 < local_f98) {
                                    ::std::__cxx11::ostringstream::ostringstream(local_12a8);
                                    poVar4 = ::std::operator<<((ostream *)local_12a8,"[error]");
                                    poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                    poVar4 = ::std::operator<<(poVar4,"[Crate]");
                                    poVar4 = ::std::operator<<(poVar4,":");
                                    poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                                    poVar4 = ::std::operator<<(poVar4,"():");
                                    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x14b1);
                                    ::std::operator<<(poVar4," ");
                                    poVar4 = ::std::operator<<((ostream *)local_12a8,
                                                                                                                              
                                                  "Invalid Compressed elementTokenIndexes size.");
                                    ::std::operator<<(poVar4,"\n");
                                    ::std::__cxx11::ostringstream::str();
                                    PushError(this,&local_12c8);
                                    ::std::__cxx11::string::~string((string *)&local_12c8);
                                    this_local._7_1_ = 0;
                                    ::std::__cxx11::ostringstream::~ostringstream(local_12a8);
                                  }
                                  else {
                                    this->_memoryUsage = (long)local_f98 + this->_memoryUsage;
                                    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                                      ::std::__cxx11::ostringstream::ostringstream(local_1440);
                                      poVar4 = ::std::operator<<((ostream *)local_1440,"[error]");
                                      poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                      poVar4 = ::std::operator<<(poVar4,"[Crate]");
                                      poVar4 = ::std::operator<<(poVar4,":");
                                      poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                                      poVar4 = ::std::operator<<(poVar4,"():");
                                      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x14b4);
                                      ::std::operator<<(poVar4," ");
                                      poVar4 = ::std::operator<<((ostream *)local_1440,
                                                                 "Reached to max memory budget.");
                                      ::std::operator<<(poVar4,"\n");
                                      ::std::__cxx11::ostringstream::str();
                                      PushError(this,&local_1460);
                                      ::std::__cxx11::string::~string((string *)&local_1460);
                                      this_local._7_1_ = 0;
                                      ::std::__cxx11::ostringstream::~ostringstream(local_1440);
                                    }
                                    else {
                                      pSVar1 = this->_sr;
                                      pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                                         ((vector<char,_std::allocator<char>_> *)
                                                          local_568);
                                      pvVar5 = (void *)StreamReader::read(pSVar1,(int)pvVar2,pvVar2,
                                                                          (size_t)pcVar6);
                                      if (pvVar2 == pvVar5) {
                                        ::std::__cxx11::string::string((string *)local_1618);
                                        pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            local_568);
                                        piVar10 = ::std::vector<int,_std::allocator<int>_>::data
                                                            ((vector<int,_std::allocator<int>_> *)
                                                             &numEncodedPaths);
                                        uVar9 = local_70;
                                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            local_588);
                                        err_00 = (string *)local_1618;
                                        Usd_IntegerCompression::DecompressFromBuffer
                                                  (pcVar6,(size_t)local_f98,piVar10,uVar9,err_00,
                                                   pcVar8);
                                        uVar9 = ::std::__cxx11::string::empty();
                                        bVar3 = (uVar9 & 1) != 0;
                                        if (!bVar3) {
                                          ::std::__cxx11::ostringstream::ostringstream(local_1790);
                                          poVar4 = ::std::operator<<((ostream *)local_1790,"[error]"
                                                                    );
                                          poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                          poVar4 = ::std::operator<<(poVar4,":");
                                          poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                                          poVar4 = ::std::operator<<(poVar4,"():");
                                          poVar4 = (ostream *)
                                                   ::std::ostream::operator<<(poVar4,0x14c3);
                                          ::std::operator<<(poVar4," ");
                                          poVar4 = ::std::operator<<((ostream *)local_1790,
                                                                     "Failed to decode jumps.");
                                          ::std::operator<<(poVar4,"\n");
                                          ::std::__cxx11::ostringstream::str();
                                          PushError(this,(string *)
                                                         &visit_table.
                                                          super__Bvector_base<std::allocator<bool>_>
                                                          ._M_impl.super__Bvector_impl_data.
                                                          _M_end_of_storage);
                                          ::std::__cxx11::string::~string
                                                    ((string *)
                                                     &visit_table.
                                                      super__Bvector_base<std::allocator<bool>_>.
                                                      _M_impl.super__Bvector_impl_data.
                                                      _M_end_of_storage);
                                          ::std::__cxx11::ostringstream::~ostringstream(local_1790);
                                          this_local._7_1_ = 0;
                                        }
                                        ::std::__cxx11::string::~string((string *)local_1618);
                                        if (bVar3) {
                                          ::std::vector<bool,_std::allocator<bool>_>::vector
                                                    ((vector<bool,_std::allocator<bool>_> *)
                                                     local_17d8);
                                          sVar11 = ::std::
                                                  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                  ::size(&this->_paths);
                                          this->_memoryUsage = sVar11 + this->_memoryUsage;
                                          if ((this->_config).maxMemoryBudget < this->_memoryUsage)
                                          {
                                            ::std::__cxx11::ostringstream::ostringstream(local_1950)
                                            ;
                                            poVar4 = ::std::operator<<((ostream *)local_1950,
                                                                       "[error]");
                                            poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                            poVar4 = ::std::operator<<(poVar4,"[Crate]");
                                            poVar4 = ::std::operator<<(poVar4,":");
                                            poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths")
                                            ;
                                            poVar4 = ::std::operator<<(poVar4,"():");
                                            poVar4 = (ostream *)
                                                     ::std::ostream::operator<<(poVar4,0x14e3);
                                            ::std::operator<<(poVar4," ");
                                            poVar4 = ::std::operator<<((ostream *)local_1950,
                                                                                                                                              
                                                  "Reached to max memory budget.");
                                            ::std::operator<<(poVar4,"\n");
                                            ::std::__cxx11::ostringstream::str();
                                            PushError(this,(string *)&i);
                                            ::std::__cxx11::string::~string((string *)&i);
                                            this_local._7_1_ = 0;
                                            ::std::__cxx11::ostringstream::~ostringstream
                                                      (local_1950);
                                          }
                                          else {
                                            sVar11 = ::std::
                                                  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                  ::size(&this->_paths);
                                            ::std::vector<bool,_std::allocator<bool>_>::resize
                                                      ((vector<bool,_std::allocator<bool>_> *)
                                                       local_17d8,sVar11,false);
                                            for (local_1978 = 0;
                                                sVar11 = ::std::vector<bool,_std::allocator<bool>_>
                                                         ::size((vector<bool,_std::allocator<bool>_>
                                                                 *)local_17d8), local_1978 < sVar11;
                                                local_1978 = local_1978 + 1) {
                                              join_0x00000010_0x00000000_ =
                                                   ::std::vector<bool,_std::allocator<bool>_>::
                                                   operator[]((vector<bool,_std::allocator<bool>_> *
                                                              )local_17d8,local_1978);
                                              ::std::_Bit_reference::operator=
                                                        ((_Bit_reference *)&arg.parentPath._valid,
                                                         false);
                                            }
                                            BuildDecompressedPathsArg::BuildDecompressedPathsArg
                                                      ((BuildDecompressedPathsArg *)local_1a88);
                                            local_1a88 = (undefined1  [8])
                                                         &elementTokenIndexes.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                                            arg.pathIndexes =
                                                 (vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)&jumps.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                                            arg.elementTokenIndexes =
                                                 (vector<int,_std::allocator<int>_> *)
                                                 &numEncodedPaths;
                                            arg.jumps = (vector<int,_std::allocator<int>_> *)
                                                        local_17d8;
                                            arg.visit_table =
                                                 (vector<bool,_std::allocator<bool>_> *)0x0;
                                            sVar11 = ::std::
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ::size((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)&elementTokenIndexes.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage);
                                            arg.startIndex = sVar11 - 1;
                                            Path::Path((Path *)&sumDecodedPaths);
                                            Path::operator=((Path *)&arg.endIndex,
                                                            (Path *)&sumDecodedPaths);
                                            Path::~Path((Path *)&sumDecodedPaths);
                                            bVar3 = BuildDecompressedPathsImpl
                                                              (this,(BuildDecompressedPathsArg *)
                                                                    local_1a88);
                                            if (bVar3) {
                                              i_1 = 0;
                                              for (local_1b68 = 0; uVar9 = local_1b68,
                                                  sVar11 = ::std::
                                                  vector<bool,_std::allocator<bool>_>::size
                                                            ((vector<bool,_std::allocator<bool>_> *)
                                                             local_17d8), uVar9 < sVar11;
                                                  local_1b68 = local_1b68 + 1) {
                                                local_1b78 = ::std::
                                                  vector<bool,_std::allocator<bool>_>::operator[]
                                                            ((vector<bool,_std::allocator<bool>_> *)
                                                             local_17d8,local_1b68);
                                                bVar3 = ::std::_Bit_reference::operator_cast_to_bool
                                                                  (&local_1b78);
                                                if (bVar3) {
                                                  i_1 = i_1 + 1;
                                                }
                                              }
                                              if (i_1 == local_70) {
                                                for (local_1d60 = 0; uVar9 = local_1d60,
                                                    sVar11 = ::std::
                                                  vector<bool,_std::allocator<bool>_>::size
                                                            ((vector<bool,_std::allocator<bool>_> *)
                                                             local_17d8), uVar9 < sVar11;
                                                  local_1d60 = local_1d60 + 1) {
                                                  _i_3 = ::std::vector<bool,_std::allocator<bool>_>
                                                         ::operator[]((
                                                  vector<bool,_std::allocator<bool>_> *)local_17d8,
                                                  local_1d60);
                                                  ::std::_Bit_reference::operator=
                                                            ((_Bit_reference *)&i_3,false);
                                                }
                                                visit_table_00 =
                                                     (vector<bool,_std::allocator<bool>_> *)
                                                     local_17d8;
                                                bVar3 = BuildNodeHierarchy(this,(
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)&elementTokenIndexes.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage,
                                                  (vector<int,_std::allocator<int>_> *)
                                                  &jumps.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                                  (vector<int,_std::allocator<int>_> *)
                                                  &numEncodedPaths,visit_table_00,0,-1);
                                                if (bVar3) {
                                                  i_1 = 0;
                                                  for (local_1d78 = 0; uVar9 = local_1d78,
                                                      sVar11 = ::std::
                                                  vector<bool,_std::allocator<bool>_>::size
                                                            ((vector<bool,_std::allocator<bool>_> *)
                                                             local_17d8), uVar9 < sVar11;
                                                  local_1d78 = local_1d78 + 1) {
                                                    local_1d88 = ::std::
                                                  vector<bool,_std::allocator<bool>_>::operator[]
                                                            ((vector<bool,_std::allocator<bool>_> *)
                                                             local_17d8,local_1d78);
                                                  bVar3 = ::std::_Bit_reference::
                                                          operator_cast_to_bool(&local_1d88);
                                                  if (bVar3) {
                                                    i_1 = i_1 + 1;
                                                  }
                                                  }
                                                  if (i_1 == local_70) {
                                                    this_local._7_1_ = 1;
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_1f00);
                                                    poVar4 = ::std::operator<<((ostream *)local_1f00
                                                                               ,"[error]");
                                                    poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                                  poVar4 = ::std::operator<<(poVar4,":");
                                                  poVar4 = ::std::operator<<(poVar4,
                                                  "ReadCompressedPaths");
                                                  poVar4 = ::std::operator<<(poVar4,"():");
                                                  poVar4 = (ostream *)
                                                           ::std::ostream::operator<<(poVar4,0x1522)
                                                  ;
                                                  ::std::operator<<(poVar4," ");
                                                  ::std::allocator<char>::allocator();
                                                  ::std::__cxx11::string::string
                                                            (local_1f40,
                                                                                                                          
                                                  "Decoded {} paths but numEncodedPaths in BuildNodeHierarchy is {}. Possible corruption of Crate data."
                                                  ,&local_1f41);
                                                  fmt::format<unsigned_long,unsigned_long>
                                                            (&local_1f20,(fmt *)local_1f40,
                                                             (string *)&i_1,&local_70,
                                                             (unsigned_long *)visit_table_00);
                                                  poVar4 = ::std::operator<<((ostream *)local_1f00,
                                                                             (string *)&local_1f20);
                                                  ::std::operator<<(poVar4,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_1f20);
                                                  ::std::__cxx11::string::~string(local_1f40);
                                                  ::std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_1f41);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_1f68);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_1f68);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_1f00);
                                                  }
                                                }
                                                else {
                                                  this_local._7_1_ = 0;
                                                }
                                              }
                                              else {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_1cf0);
                                                poVar4 = ::std::operator<<((ostream *)local_1cf0,
                                                                           "[error]");
                                                poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                                poVar4 = ::std::operator<<(poVar4,":");
                                                poVar4 = ::std::operator<<(poVar4,
                                                  "ReadCompressedPaths");
                                                poVar4 = ::std::operator<<(poVar4,"():");
                                                poVar4 = (ostream *)
                                                         ::std::ostream::operator<<(poVar4,0x150b);
                                                ::std::operator<<(poVar4," ");
                                                ::std::allocator<char>::allocator();
                                                ::std::__cxx11::string::string
                                                          (local_1d30,
                                                                                                                      
                                                  "Decoded {} paths but numEncodedPaths in Crate is {}. Possible corruption of Crate data."
                                                  ,&local_1d31);
                                                fmt::format<unsigned_long,unsigned_long>
                                                          (&local_1d10,(fmt *)local_1d30,
                                                           (string *)&i_1,&local_70,
                                                           (unsigned_long *)err_00);
                                                poVar4 = ::std::operator<<((ostream *)local_1cf0,
                                                                           (string *)&local_1d10);
                                                ::std::operator<<(poVar4,"\n");
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1d10);
                                                ::std::__cxx11::string::~string(local_1d30);
                                                ::std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_1d31);
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,(string *)&i_2);
                                                ::std::__cxx11::string::~string((string *)&i_2);
                                                this_local._7_1_ = 0;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_1cf0);
                                              }
                                            }
                                            else {
                                              this_local._7_1_ = 0;
                                            }
                                            BuildDecompressedPathsArg::~BuildDecompressedPathsArg
                                                      ((BuildDecompressedPathsArg *)local_1a88);
                                          }
                                          ::std::vector<bool,_std::allocator<bool>_>::~vector
                                                    ((vector<bool,_std::allocator<bool>_> *)
                                                     local_17d8);
                                        }
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream(local_15d8);
                                        poVar4 = ::std::operator<<((ostream *)local_15d8,"[error]");
                                        poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                        poVar4 = ::std::operator<<(poVar4,":");
                                        poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                                        poVar4 = ::std::operator<<(poVar4,"():");
                                        poVar4 = (ostream *)
                                                 ::std::ostream::operator<<(poVar4,0x14b9);
                                        ::std::operator<<(poVar4," ");
                                        poVar4 = ::std::operator<<((ostream *)local_15d8,
                                                                                                                                      
                                                  "Failed to read compressed jumps data.");
                                        ::std::operator<<(poVar4,"\n");
                                        ::std::__cxx11::ostringstream::str();
                                        PushError(this,(string *)((long)&err_2.field_2 + 8));
                                        ::std::__cxx11::string::~string
                                                  ((string *)(err_2.field_2._M_local_buf + 8));
                                        ::std::__cxx11::ostringstream::~ostringstream(local_15d8);
                                        this_local._7_1_ = 0;
                                      }
                                    }
                                  }
                                }
                                else {
                                  ::std::__cxx11::ostringstream::ostringstream(local_1110);
                                  poVar4 = ::std::operator<<((ostream *)local_1110,"[error]");
                                  poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                  poVar4 = ::std::operator<<(poVar4,":");
                                  poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                                  poVar4 = ::std::operator<<(poVar4,"():");
                                  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x14ac);
                                  ::std::operator<<(poVar4," ");
                                  poVar4 = ::std::operator<<((ostream *)local_1110,
                                                             "Failed to read compressed jumpsSize.")
                                  ;
                                  ::std::operator<<(poVar4,"\n");
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,&local_1130);
                                  ::std::__cxx11::string::~string((string *)&local_1130);
                                  ::std::__cxx11::ostringstream::~ostringstream(local_1110);
                                  this_local._7_1_ = 0;
                                }
                              }
                            }
                            else {
                              ::std::__cxx11::ostringstream::ostringstream(local_db8);
                              poVar4 = ::std::operator<<((ostream *)local_db8,"[error]");
                              poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                              poVar4 = ::std::operator<<(poVar4,":");
                              poVar4 = ::std::operator<<(poVar4,"ReadCompressedPaths");
                              poVar4 = ::std::operator<<(poVar4,"():");
                              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1498);
                              ::std::operator<<(poVar4," ");
                              poVar4 = ::std::operator<<((ostream *)local_db8,
                                                         "Failed to read elementTokenIndexes data.")
                              ;
                              ::std::operator<<(poVar4,"\n");
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,(string *)((long)&err_1.field_2 + 8));
                              ::std::__cxx11::string::~string
                                        ((string *)(err_1.field_2._M_local_buf + 8));
                              ::std::__cxx11::ostringstream::~ostringstream(local_db8);
                              this_local._7_1_ = 0;
                            }
                          }
                        }
                      }
                      else {
                        ::std::__cxx11::string::operator+=
                                  ((string *)&this->_err,"Failed to read elementTokenIndexesSize.\n"
                                  );
                        this_local._7_1_ = 0;
                      }
                    }
                  }
                  else {
                    ::std::__cxx11::string::operator+=
                              ((string *)&this->_err,"Failed to read compressed pathIndexes data.\n"
                              );
                    this_local._7_1_ = 0;
                  }
                }
              }
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read pathIndexesSize.\n");
              this_local._7_1_ = 0;
            }
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)local_588);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)local_568);
          }
        }
      }
    }
  }
  else {
    ::std::__cxx11::string::operator+=
              ((string *)&this->_err,"Failed to read the number of encoded paths.\n");
    this_local._7_1_ = 0;
  }
  ::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&numEncodedPaths);
  ::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &jumps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &elementTokenIndexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadCompressedPaths(const uint64_t maxNumPaths) {
  std::vector<uint32_t> pathIndexes;
  std::vector<int32_t> elementTokenIndexes;
  std::vector<int32_t> jumps;

  // Read number of encoded paths.
  uint64_t numEncodedPaths;
  if (!_sr->read8(&numEncodedPaths)) {
    _err += "Failed to read the number of encoded paths.\n";
    return false;
  }

  DCOUT("maxNumPaths : " << maxNumPaths);
  DCOUT("numEncodedPaths : " << numEncodedPaths);

  // Number of compressed paths could be less than maxNumPaths,
  // but should not be greater.
  if (maxNumPaths < numEncodedPaths) {
    _err += "Size mismatch of numEncodedPaths at `PATHS` section.\n";
    return false;
  }


  // 3 = pathIndex, elementTokenIndex, jump
  CHECK_MEMORY_USAGE(size_t(numEncodedPaths) * sizeof(int32_t) * 3);

  pathIndexes.resize(static_cast<size_t>(numEncodedPaths));
  elementTokenIndexes.resize(static_cast<size_t>(numEncodedPaths));
  jumps.resize(static_cast<size_t>(numEncodedPaths));

  size_t compBufferSize = Usd_IntegerCompression::GetCompressedBufferSize(static_cast<size_t>(numEncodedPaths));
  size_t workspaceBufferSize = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(static_cast<size_t>(numEncodedPaths));
  CHECK_MEMORY_USAGE(compBufferSize);
  CHECK_MEMORY_USAGE(workspaceBufferSize);

  // Create temporary space for decompressing.
  std::vector<char> compBuffer(compBufferSize);
  std::vector<char> workingSpace(workspaceBufferSize);

  // pathIndexes.
  {
    uint64_t compPathIndexesSize;
    if (!_sr->read8(&compPathIndexesSize)) {
      _err += "Failed to read pathIndexesSize.\n";
      return false;
    }

    if (compPathIndexesSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed PathIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compPathIndexesSize));

    if (compPathIndexesSize !=
        _sr->read(size_t(compPathIndexesSize), size_t(compPathIndexesSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      _err += "Failed to read compressed pathIndexes data.\n";
      return false;
    }

    DCOUT("comBuffer.size = " << compBuffer.size());
    DCOUT("compPathIndexesSize = " << compPathIndexesSize);

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compPathIndexesSize), pathIndexes.data(),
        size_t(numEncodedPaths), &err, workingSpace.data());
    if (!err.empty()) {
      _err += "Failed to decode pathIndexes\n" + err;
      return false;
    }
  }

  // elementTokenIndexes.
  {
    uint64_t compElementTokenIndexesSize;
    if (!_sr->read8(&compElementTokenIndexesSize)) {
      _err += "Failed to read elementTokenIndexesSize.\n";
      return false;
    }

    if (compElementTokenIndexesSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed elementTokenIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compElementTokenIndexesSize));

    if (compElementTokenIndexesSize !=
        _sr->read(size_t(compElementTokenIndexesSize),
                  size_t(compElementTokenIndexesSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      PUSH_ERROR("Failed to read elementTokenIndexes data.");
      return false;
    }

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compElementTokenIndexesSize),
        elementTokenIndexes.data(), size_t(numEncodedPaths), &err,
        workingSpace.data());

    if (!err.empty()) {
      PUSH_ERROR("Failed to decode elementTokenIndexes.");
      return false;
    }
  }

  // jumps.
  {
    uint64_t compJumpsSize;
    if (!_sr->read8(&compJumpsSize)) {
      PUSH_ERROR("Failed to read compressed jumpsSize.");
      return false;
    }

    if (compJumpsSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed elementTokenIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compJumpsSize));

    if (compJumpsSize !=
        _sr->read(size_t(compJumpsSize), size_t(compJumpsSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      PUSH_ERROR("Failed to read compressed jumps data.");
      return false;
    }

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compJumpsSize), jumps.data(), size_t(numEncodedPaths),
        &err, workingSpace.data());

    if (!err.empty()) {
      PUSH_ERROR("Failed to decode jumps.");
      return false;
    }
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < pathIndexes.size(); i++) {
    DCOUT("pathIndexes[" << i << "] = " << pathIndexes[i]);
  }

  for (size_t i = 0; i < elementTokenIndexes.size(); i++) {
    std::stringstream ss;
    ss << "elementTokenIndexes[" << i << "] = " << elementTokenIndexes[i];
    int32_t tokIdx = elementTokenIndexes[i];
    if (tokIdx < 0) {
      // Property Path. Need to negate it.
      tokIdx = -tokIdx;
    }
    if (auto tokv = GetToken(crate::Index(uint32_t(tokIdx)))) {
      ss << "(" << tokv.value() << ")";
    }
    ss << "\n";
    DCOUT(ss.str());
  }

  for (size_t i = 0; i < jumps.size(); i++) {
    DCOUT(fmt::format("jumps[{}] = {}", i, jumps[i]));
  }
#endif

  // For circular tree check
  std::vector<bool> visit_table;
  CHECK_MEMORY_USAGE(_paths.size()); // TODO: divide by 8?

  // `_paths` is already initialized just before calling this ReadCompressedPaths
  visit_table.resize(_paths.size());
  for (size_t i = 0; i < visit_table.size(); i++) {
    visit_table[i] = false;
  }

  // Now build the paths.
#if defined(TINYUSDZ_CRATE_USE_FOR_BASED_PATH_INDEX_DECODER)
  BuildDecompressedPathsArg arg;
  arg.pathIndexes = &pathIndexes;
  arg.elementTokenIndexes = &elementTokenIndexes;
  arg.jumps = &jumps;
  arg.visit_table = &visit_table;
  arg.startIndex = 0;
  arg.endIndex = pathIndexes.size() - 1; // or numEncodedPaths - 1
  arg.parentPath = Path();
  if (!BuildDecompressedPathsImpl(&arg)) {
    return false;
  }

#else
  if (!BuildDecompressedPathsImpl(pathIndexes, elementTokenIndexes, jumps, visit_table,
                                  /* curIndex */ 0, Path())) {
    return false;
  }
#endif

  //
  // Ensure decoded numEncodedPaths.
  //
  size_t sumDecodedPaths = 0;
  for (size_t i = 0; i < visit_table.size(); i++) {
    if (visit_table[i]) {
      sumDecodedPaths++;
    }
  }
  if (sumDecodedPaths != numEncodedPaths) {
    PUSH_ERROR_AND_RETURN(fmt::format("Decoded {} paths but numEncodedPaths in Crate is {}. Possible corruption of Crate data.",
      sumDecodedPaths, numEncodedPaths));
  }

  // Now build node hierarchy.

  // Circular referencing check should be done in BuildDecompressedPathsImpl,
  // but do check it again just in case.
  for (size_t i = 0; i < visit_table.size(); i++) {
    visit_table[i] = false;
  }
  if (!BuildNodeHierarchy(pathIndexes, elementTokenIndexes, jumps, visit_table,
                          /* curIndex */ 0, /* parent node index */ -1)) {
    return false;
  }

  sumDecodedPaths = 0;
  for (size_t i = 0; i < visit_table.size(); i++) {
    if (visit_table[i]) {
      sumDecodedPaths++;
    }
  }
  if (sumDecodedPaths != numEncodedPaths) {
    PUSH_ERROR_AND_RETURN(fmt::format("Decoded {} paths but numEncodedPaths in BuildNodeHierarchy is {}. Possible corruption of Crate data.",
      sumDecodedPaths, numEncodedPaths));
  }

  return true;
}